

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::removeLazyVar(SAT *this,int v)

{
  int v_local;
  SAT *this_local;
  
  return;
}

Assistant:

void SAT::removeLazyVar(int v) {
	return;
	const ChannelInfo& ci = c_info[v];
	assert(assigns[v] == toInt(l_Undef));
	assert(watches[2 * v].size() == 0);
	assert(watches[2 * v + 1].size() == 0);
	fprintf(stderr, "free %d\n", v);
	var_free_list.push(v);
	if (ci.cons_type == 1) {
		((IntVarLL*)engine.vars[ci.cons_id])->freeLazyVar(ci.val);
	} else if (ci.cons_type == 2) {
		engine.propagators[ci.cons_id]->freeLazyVar(ci.val);
	} else {
		NEVER;
	}
}